

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_queries.cpp
# Opt level: O2

string * __thiscall
duckdb::PragmaShow_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,ClientContext *context,
          FunctionParameters *parameters)

{
  const_reference this_00;
  string local_30;
  
  this_00 = vector<duckdb::Value,_true>::get<true>((vector<duckdb::Value,_true> *)context,0);
  Value::ToString_abi_cxx11_(&local_30,this_00);
  PragmaShow(__return_storage_ptr__,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string PragmaShow(ClientContext &context, const FunctionParameters &parameters) {
	return PragmaShow(parameters.values[0].ToString());
}